

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
* get_primes<libdivide::divider<short,(libdivide::Branching)1>,short>(short max)

{
  short sVar1;
  uint uVar2;
  vector<char,_std::allocator<char>_> *this;
  reference pvVar3;
  byte bVar4;
  short in_SI;
  vector<char,_std::allocator<char>_> *in_RDI;
  size_t i_1;
  size_t j;
  size_t i;
  vector<char,_std::allocator<char>_> sieve;
  size_t n;
  vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
  *primes;
  libdivide_s16_t tmp;
  libdivide_s16_branchfree_t result;
  int16_t magic;
  uint16_t twice_rem;
  uint16_t e;
  uint16_t proposed_m;
  uint16_t rem;
  uint8_t more;
  uint16_t floor_log_2_d;
  uint16_t absD;
  uint16_t ud;
  libdivide_s16_t result_1;
  uint16_t result_2;
  uint32_t n_1;
  value_type *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  allocator_type *in_stack_fffffffffffffef8;
  vector<char,_std::allocator<char>_> *__n;
  short local_db;
  byte local_d9;
  size_type local_d8;
  undefined1 local_c9;
  size_type local_c8;
  size_type local_c0;
  allocator<char> local_a2;
  undefined1 local_a1;
  vector<char,_std::allocator<char>_> local_a0;
  ulong local_88;
  ushort local_6a;
  short *local_68;
  ushort local_5a;
  short *local_58;
  short local_4c;
  byte local_4a;
  short local_45;
  byte local_43;
  ushort local_42;
  short local_3f;
  byte local_3d;
  short local_3c;
  byte local_3a;
  short local_36;
  ushort local_34;
  short local_32;
  short local_30;
  undefined1 local_2e [3];
  byte local_2b;
  short local_2a;
  ushort local_28;
  ushort local_26;
  undefined4 local_24;
  ushort local_1e;
  short local_1b;
  byte local_19;
  ushort local_18;
  short local_16;
  uint local_14;
  undefined1 *local_10;
  ushort local_6;
  uint local_4;
  
  local_88 = (ulong)in_SI;
  this = (vector<char,_std::allocator<char>_> *)(local_88 + 1);
  local_a1 = 1;
  __n = in_RDI;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (this,(size_type)__n,(value_type *)in_RDI,in_stack_fffffffffffffef8);
  std::allocator<char>::~allocator(&local_a2);
  for (local_c0 = 2; local_c0 * local_c0 < local_88 || local_c0 * local_c0 - local_88 == 0;
      local_c0 = local_c0 + 1) {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_a0,local_c0);
    if (*pvVar3 != '\0') {
      for (local_c8 = local_c0 * local_c0; local_c8 <= local_88; local_c8 = local_c0 + local_c8) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_a0,local_c8);
        *pvVar3 = '\0';
      }
    }
  }
  local_c9 = 0;
  std::
  vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
  ::vector((vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
            *)0x109c1c);
  local_d8 = 2;
  do {
    if (local_88 < local_d8) {
      local_c9 = 1;
      std::vector<char,_std::allocator<char>_>::~vector(in_RDI);
      return (vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
              *)__n;
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_a0,local_d8);
    if (*pvVar3 != '\0') {
      local_68 = &local_db;
      local_6a = (ushort)local_d8;
      local_24 = 1;
      local_5a = local_6a;
      local_58 = local_68;
      local_42 = local_6a;
      local_1e = local_6a;
      if (local_6a == 0) {
        fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x4fb,"libdivide_internal_s16_gen",
                "divider must be != 0");
        abort();
      }
      if ((short)local_6a < 0) {
        uVar2 = -(uint)local_6a;
      }
      else {
        uVar2 = (uint)local_6a;
      }
      local_28 = (ushort)uVar2;
      local_2a = 0xf - ((short)LZCOUNT(uVar2 & 0xffff) + -0x10);
      local_19 = (byte)local_2a;
      if ((uVar2 & 0xffff & (uVar2 & 0xffff) - 1) == 0) {
        local_1b = 0;
        bVar4 = 0;
        if ((short)local_6a < 0) {
          bVar4 = 0x80;
        }
        local_19 = local_19 | bVar4;
      }
      else {
        local_4 = (1 << (local_19 - 1 & 0x1f)) << 0x10;
        local_10 = local_2e;
        local_14 = local_4;
        local_16 = (short)(local_4 / (uVar2 & 0xffff));
        sVar1 = local_16 * local_28;
        local_32 = local_28 + sVar1;
        local_30 = local_16 * 2;
        local_34 = sVar1 * -2;
        if ((local_28 <= local_34) || (local_34 < (ushort)-sVar1)) {
          local_30 = local_30 + 1;
        }
        local_2b = local_19 | 0x40;
        local_36 = local_30 + 1;
        if ((short)local_6a < 0) {
          local_2b = local_19 | 0xc0;
        }
        local_19 = local_2b;
        local_30 = local_36;
        local_1b = local_36;
        local_6 = local_28;
      }
      local_3a = local_19;
      local_3c = local_1b;
      local_43 = local_19;
      local_45 = local_1b;
      local_3f = local_1b;
      local_3d = local_19;
      local_4a = local_19;
      local_4c = local_1b;
      local_d9 = local_19;
      local_db = local_1b;
      local_26 = local_6a;
      local_18 = local_28;
      std::
      vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
      ::push_back((vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
                   *)CONCAT44(uVar2,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8);
    }
    local_d8 = local_d8 + 1;
  } while( true );
}

Assistant:

std::vector<divider_type> get_primes(T max) {
    size_t n = (size_t)max;
    std::vector<char> sieve(n + 1, true);

    for (size_t i = 2; i * i <= n; i++)
        if (sieve[i])
            for (size_t j = i * i; j <= n; j += i) sieve[j] = false;

    std::vector<divider_type> primes;
    for (size_t i = 2; i <= n; i++)
        if (sieve[i]) primes.push_back((T)i);

    return primes;
}